

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::TimeCorrFunc<double>::TimeCorrFunc
          (TimeCorrFunc<double> *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Globals *__new_size;
  string *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  double zeroType;
  Globals *simParams;
  string *in_stack_00000110;
  SimInfo *in_stack_00000118;
  SimInfo *in_stack_00000168;
  SelectionManager *in_stack_00000170;
  unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
  *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  errorStruct *in_stack_fffffffffffffed0;
  RealType in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  SimInfo *in_stack_ffffffffffffffb8;
  SelectionEvaluator *in_stack_ffffffffffffffc0;
  
  DynamicProperty::DynamicProperty
            ((DynamicProperty *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  *in_RDI = &PTR__TimeCorrFunc_004e22d0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17f3f7);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17f410);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17f429);
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 0x15),in_RDX);
  SelectionManager::SelectionManager(in_stack_00000170,in_stack_00000168);
  SelectionManager::SelectionManager(in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::string((string *)(in_RDI + 0x4c),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0x50),in_R8);
  SelectionEvaluator::SelectionEvaluator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  SelectionEvaluator::SelectionEvaluator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined1 *)((long)in_RDI + 0xd41) = 0;
  *(undefined1 *)((long)in_RDI + 0xd42) = 0;
  *(undefined1 *)((long)in_RDI + 0xd43) = 0;
  *(undefined1 *)((long)in_RDI + 0xd44) = 0;
  *(undefined1 *)((long)in_RDI + 0xd46) = 0;
  *(undefined1 *)((long)in_RDI + 0xd47) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a9));
  std::__cxx11::string::string((string *)(in_RDI + 0x1ad));
  std::__cxx11::string::string((string *)(in_RDI + 0x1b1));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17f5ee);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17f607);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17f620);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17f639);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17f652);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17f66e);
  std::unique_ptr<OpenMD::ProgressBar,std::default_delete<OpenMD::ProgressBar>>::
  unique_ptr<std::default_delete<OpenMD::ProgressBar>,void>
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  pvVar4 = operator_new(0x1258);
  DumpReader::DumpReader((DumpReader *)sele2,in_stack_00000118,in_stack_00000110);
  in_RDI[0x14] = pvVar4;
  iVar2 = std::__cxx11::string::compare(in_RCX);
  *(bool *)(in_RDI + 0x1a8) = iVar2 != 0;
  __new_size = SimInfo::getSimParams((SimInfo *)in_RDI[0x13]);
  uVar1 = Globals::haveSampleTime((Globals *)0x17f737);
  if ((bool)uVar1) {
    in_stack_fffffffffffffed8 = Globals::getSampleTime((Globals *)0x17f757);
    in_RDI[6] = in_stack_fffffffffffffed8;
  }
  else {
    in_stack_fffffffffffffed0 = &painCave;
    snprintf(painCave.errMsg,2000,"TimeCorrFunc Error: can not figure out deltaTime\n");
    in_stack_fffffffffffffed0->isFatal = 1;
    simError();
  }
  snprintf(painCave.errMsg,2000,"Scanning for frames.");
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  iVar3 = DumpReader::getNFrames
                    ((DumpReader *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  *(int *)((long)in_RDI + 0x3c) = iVar3;
  *(undefined4 *)(in_RDI + 7) = *(undefined4 *)((long)in_RDI + 0x3c);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar2,in_stack_fffffffffffffef0),
             (size_type)__new_size,(value_type_conflict *)CONCAT17(uVar1,in_stack_fffffffffffffee0))
  ;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_fffffffffffffef0),
             (size_type)__new_size,(value_type_conflict2 *)CONCAT17(uVar1,in_stack_fffffffffffffee0)
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffee0),
             (size_type)in_stack_fffffffffffffed8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT17(uVar1,in_stack_fffffffffffffee0),(size_type)in_stack_fffffffffffffed8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT17(uVar1,in_stack_fffffffffffffee0),(size_type)in_stack_fffffffffffffed8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT17(uVar1,in_stack_fffffffffffffee0),(size_type)in_stack_fffffffffffffed8);
  if ((*(byte *)(in_RDI + 0x1a8) & 1) != 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT17(uVar1,in_stack_fffffffffffffee0),(size_type)in_stack_fffffffffffffed8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT17(uVar1,in_stack_fffffffffffffee0),(size_type)in_stack_fffffffffffffed8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT17(uVar1,in_stack_fffffffffffffee0),(size_type)in_stack_fffffffffffffed8);
  }
  std::make_unique<OpenMD::ProgressBar>();
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::operator=
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8);
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::~unique_ptr
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             in_stack_fffffffffffffed0);
  return;
}

Assistant:

TimeCorrFunc<T>::TimeCorrFunc(SimInfo* info, const string& filename,
                                const string& sele1, const string& sele2) :
      info_(info),
      dumpFilename_(filename), seleMan1_(info_), seleMan2_(info_),
      selectionScript1_(sele1), selectionScript2_(sele2), evaluator1_(info_),
      evaluator2_(info_), autoCorrFunc_(false), doSystemProperties_(false),
      doMolecularProperties_(false), doObjectProperties_(false),
      doBondProperties_(false), allowTimeFuzz_(false) {
    reader_ = new DumpReader(info_, dumpFilename_);

    uniqueSelections_ = (sele1.compare(sele2) != 0) ? true : false;

    Globals* simParams = info_->getSimParams();
    if (simParams->haveSampleTime()) {
      deltaTime_ = simParams->getSampleTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TimeCorrFunc Error: can not figure out deltaTime\n");
      painCave.isFatal = 1;
      simError();
    }

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "Scanning for frames.");
    painCave.isFatal  = 0;
    painCave.severity = OPENMD_INFO;
    simError();

    nFrames_   = reader_->getNFrames();
    nTimeBins_ = nFrames_;

    T zeroType(0.0);
    histogram_.resize(nTimeBins_, zeroType);
    count_.resize(nTimeBins_, 0);

    times_.resize(nFrames_);
    sele1ToIndex_.resize(nFrames_);
    GIDtoSele1_.resize(nFrames_);
    selection1StartFrame_.resize(nFrames_);

    if (uniqueSelections_) { 
      sele2ToIndex_.resize(nFrames_); 
      GIDtoSele2_.resize(nFrames_);
      selection2StartFrame_.resize(nFrames_);
    }

    progressBar_ = std::make_unique<ProgressBar>();
  }